

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup>::
emplaceRealloc<slang::ast::CaseAssertionExpr::ItemGroup>
          (SmallVectorBase<slang::ast::CaseAssertionExpr::ItemGroup> *this,pointer pos,
          ItemGroup *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  size_t sVar3;
  ItemGroup *__cur_1;
  pointer pIVar4;
  pointer pIVar5;
  pointer pIVar6;
  pointer pIVar7;
  AssertionExpr *pAVar8;
  AssertionExpr *ctx;
  long lVar9;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  pAVar8 = (AssertionExpr *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (AssertionExpr *)(uVar1 * 2);
  if (pAVar8 < ctx) {
    pAVar8 = ctx;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    pAVar8 = (AssertionExpr *)0x555555555555555;
  }
  lVar9 = (long)pos - (long)this->data_;
  pIVar4 = (pointer)operator_new((long)pAVar8 * 0x18);
  *(AssertionExpr **)((long)pIVar4 + lVar9 + 0x10) = (args->body).ptr;
  sVar3 = (args->expressions)._M_extent._M_extent_value;
  *(undefined8 *)((long)pIVar4 + lVar9) = (args->expressions)._M_ptr;
  ((undefined8 *)((long)pIVar4 + lVar9))[1] = sVar3;
  pIVar7 = this->data_;
  pIVar5 = pIVar7 + this->len;
  pIVar6 = pIVar4;
  if (pIVar5 == pos) {
    for (; pIVar7 != pos; pIVar7 = pIVar7 + 1) {
      (pIVar6->body).ptr = (pIVar7->body).ptr;
      sVar3 = (pIVar7->expressions)._M_extent._M_extent_value;
      (pIVar6->expressions)._M_ptr = (pIVar7->expressions)._M_ptr;
      (pIVar6->expressions)._M_extent._M_extent_value = sVar3;
      pIVar6 = pIVar6 + 1;
    }
  }
  else {
    for (; pIVar7 != pos; pIVar7 = pIVar7 + 1) {
      ctx = (pIVar7->body).ptr;
      (pIVar6->body).ptr = ctx;
      sVar3 = (pIVar7->expressions)._M_extent._M_extent_value;
      (pIVar6->expressions)._M_ptr = (pIVar7->expressions)._M_ptr;
      (pIVar6->expressions)._M_extent._M_extent_value = sVar3;
      pIVar6 = pIVar6 + 1;
    }
    puVar2 = (undefined8 *)(lVar9 + (long)pIVar4);
    for (; pos != pIVar5; pos = pos + 1) {
      puVar2[5] = (pos->body).ptr;
      sVar3 = (pos->expressions)._M_extent._M_extent_value;
      puVar2[3] = (pos->expressions)._M_ptr;
      puVar2[4] = sVar3;
      puVar2 = puVar2 + 3;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pAVar8;
  this->data_ = pIVar4;
  return (pointer)((long)pIVar4 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}